

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QSpanCollection::updateRemovedColumns(QSpanCollection *this,int start,int end)

{
  bool bVar1;
  iterator __position;
  iterator it_00;
  iterator iVar2;
  int iVar3;
  int iVar4;
  Index *this_00;
  QSpanCollection *this_01;
  int iVar5;
  iterator it;
  long in_FS_OFFSET;
  Span *span;
  _List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __position._M_node =
       (this->spans).
       super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  if ((QSpanCollection *)__position._M_node != this) {
    local_50._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_50;
    local_50._M_impl._M_node._M_size = 0;
    iVar5 = (end - start) + 1;
    local_50._M_impl._M_node.super__List_node_base._M_prev =
         local_50._M_impl._M_node.super__List_node_base._M_next;
LAB_00527958:
    do {
      if ((QSpanCollection *)__position._M_node == this) goto LAB_005279eb;
      span = (Span *)__position._M_node[1]._M_next;
      iVar3 = span->m_right;
      if (start <= iVar3) {
        iVar4 = span->m_left;
        if (iVar4 < start) {
          if (end < iVar3) {
            span->m_right = iVar3 - iVar5;
            iVar3 = iVar3 - iVar5;
          }
          else {
            span->m_right = start + -1;
            iVar3 = start + -1;
          }
        }
        else if (end < iVar3) {
          bVar1 = iVar4 <= end;
          iVar4 = iVar4 - iVar5;
          if (bVar1) {
            iVar4 = start;
          }
          span->m_left = iVar4;
          iVar3 = iVar3 - iVar5;
          span->m_right = iVar3;
        }
        else {
          span->will_be_deleted = true;
        }
        if ((span->m_top == span->m_bottom) && (iVar4 == iVar3)) {
          span->will_be_deleted = true;
        }
        if (span->will_be_deleted == true) {
          std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
          push_back((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                    &local_50,&span);
          __position = std::__cxx11::
                       list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
                       erase(&this->spans,__position._M_node);
          goto LAB_00527958;
        }
      }
      __position._M_node = (__position._M_node)->_M_next;
    } while( true );
  }
LAB_00527a6d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_005279eb:
  if ((QSpanCollection *)
      (this->spans).
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next == this) {
    qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)&local_50)
    ;
    QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
  }
  else {
    this_00 = &this->index;
    it_00._M_node = (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::begin(this_00);
    while( true ) {
      this_01 = (QSpanCollection *)this_00;
      iVar2 = QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::end(this_00);
      if ((iterator)it_00._M_node == iVar2.i._M_node) break;
      bVar1 = cleanSpanSubIndex(this_01,(SubIndex *)&it_00._M_node[1]._M_parent,
                                -it_00._M_node[1]._M_color,true);
      if (bVar1) {
        it_00._M_node =
             (_Base_ptr)QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase(this_00,it_00._M_node)
        ;
      }
      else {
        it_00._M_node = (_Base_ptr)std::_Rb_tree_increment(it_00._M_node);
      }
    }
    qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)&local_50)
    ;
  }
  std::__cxx11::_List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
  _M_clear(&local_50);
  goto LAB_00527a6d;
}

Assistant:

void QSpanCollection::updateRemovedColumns(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList toBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_right < start) {
            ++it;
            continue;
        }
        if (span->m_left < start) {
            if (span->m_right <= end)
                span->m_right = start - 1;
            else
                span->m_right -= delta;
        } else {
            if (span->m_right > end) {
                if (span->m_left <= end)
                    span->m_left = start;
                else
                    span->m_left -= delta;
                span->m_right -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            toBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(toBeDeleted);
        index.clear();
        return;
    }

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ) {
        int y = -it_y.key();
        if (cleanSpanSubIndex(it_y.value(), y, true))
            it_y = index.erase(it_y);
        else
            ++it_y;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << toBeDeleted;
#endif
    qDeleteAll(toBeDeleted);
}